

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeContainerFormatParser.cpp
# Opt level: O0

void __thiscall xe::ContainerFormatParser::advance(ContainerFormatParser *this)

{
  int iVar1;
  int iVar2;
  State SVar3;
  int nextChar;
  int curChar;
  ContainerFormatParser *this_local;
  
  if (this->m_element != CONTAINERELEMENT_INCOMPLETE) {
    de::RingBuffer<unsigned_char>::popBack(&this->m_buf,this->m_elementLen);
    this->m_element = CONTAINERELEMENT_INCOMPLETE;
    this->m_elementLen = 0;
    std::__cxx11::string::clear();
    std::__cxx11::string::clear();
  }
  while( true ) {
    iVar1 = getChar(this,this->m_elementLen);
    if (iVar1 != -1) {
      this->m_elementLen = this->m_elementLen + 1;
    }
    if (iVar1 == 0) {
      if (this->m_elementLen == 1) {
        this->m_element = CONTAINERELEMENT_END_OF_STRING;
        return;
      }
      if (this->m_state == STATE_CONTAINER_LINE) {
        parseContainerLine(this);
        return;
      }
      this->m_element = CONTAINERELEMENT_TEST_LOG_DATA;
      return;
    }
    if (iVar1 == -1) break;
    if ((iVar1 == 0xd) || (iVar1 == 10)) {
      iVar2 = getChar(this,this->m_elementLen);
      if ((iVar1 == 10) || ((iVar2 != -1 && (iVar2 != 10)))) {
        if (this->m_state == STATE_CONTAINER_LINE) {
          parseContainerLine(this);
        }
        else {
          this->m_element = CONTAINERELEMENT_TEST_LOG_DATA;
        }
        this->m_state = STATE_AT_LINE_START;
        return;
      }
    }
    else if (this->m_state == STATE_AT_LINE_START) {
      SVar3 = STATE_DATA;
      if (iVar1 == 0x23) {
        SVar3 = STATE_CONTAINER_LINE;
      }
      this->m_state = SVar3;
    }
  }
  if (this->m_elementLen < 1) {
    return;
  }
  if (this->m_state != STATE_DATA) {
    return;
  }
  this->m_element = CONTAINERELEMENT_TEST_LOG_DATA;
  return;
}

Assistant:

void ContainerFormatParser::advance (void)
{
	if (m_element != CONTAINERELEMENT_INCOMPLETE)
	{
		m_buf.popBack(m_elementLen);

		m_element		= CONTAINERELEMENT_INCOMPLETE;
		m_elementLen	= 0;
		m_attribute.clear();
		m_value.clear();
	}

	for (;;)
	{
		int curChar = getChar(m_elementLen);

		if (curChar != (int)END_OF_BUFFER)
			m_elementLen += 1;

		if (curChar == END_OF_STRING)
		{
			if (m_elementLen == 1)
				m_element = CONTAINERELEMENT_END_OF_STRING;
			else if (m_state == STATE_CONTAINER_LINE)
				parseContainerLine();
			else
				m_element = CONTAINERELEMENT_TEST_LOG_DATA;

			break;
		}
		else if (curChar == (int)END_OF_BUFFER)
		{
			if (m_elementLen > 0 && m_state == STATE_DATA)
				m_element = CONTAINERELEMENT_TEST_LOG_DATA;

			break;
		}
		else if (curChar == '\r' || curChar == '\n')
		{
			// Check for \r\n
			int nextChar = getChar(m_elementLen);
			if (curChar == '\n' || (nextChar != (int)END_OF_BUFFER && nextChar != '\n'))
			{
				if (m_state == STATE_CONTAINER_LINE)
					parseContainerLine();
				else
					m_element = CONTAINERELEMENT_TEST_LOG_DATA;

				m_state = STATE_AT_LINE_START;
				break;
			}
			// else handle following end or \n in next iteration.
		}
		else if (m_state == STATE_AT_LINE_START)
		{
			DE_ASSERT(m_elementLen == 1);
			m_state = (curChar == '#') ? STATE_CONTAINER_LINE : STATE_DATA;
		}
	}
}